

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

DelaySyntax * __thiscall
slang::BumpAllocator::emplace<slang::syntax::DelaySyntax,slang::syntax::DelaySyntax_const&>
          (BumpAllocator *this,DelaySyntax *args)

{
  SyntaxNode *pSVar1;
  SyntaxNode *pSVar2;
  ExpressionSyntax *pEVar3;
  TokenKind TVar4;
  undefined1 uVar5;
  NumericTokenFlags NVar6;
  uint32_t uVar7;
  SyntaxKind SVar8;
  undefined4 uVar9;
  DelaySyntax *pDVar10;
  
  pDVar10 = (DelaySyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((DelaySyntax *)this->endPtr < pDVar10 + 1) {
    pDVar10 = (DelaySyntax *)allocateSlow(this,0x30,8);
  }
  else {
    this->head->current = (byte *)(pDVar10 + 1);
  }
  SVar8 = (args->super_TimingControlSyntax).super_SyntaxNode.kind;
  uVar9 = *(undefined4 *)&(args->super_TimingControlSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_TimingControlSyntax).super_SyntaxNode.parent;
  pSVar2 = (args->super_TimingControlSyntax).super_SyntaxNode.previewNode;
  TVar4 = (args->hash).kind;
  uVar5 = (args->hash).field_0x2;
  NVar6.raw = (args->hash).numFlags.raw;
  uVar7 = (args->hash).rawLen;
  pEVar3 = (args->delayValue).ptr;
  (pDVar10->hash).info = (args->hash).info;
  (pDVar10->delayValue).ptr = pEVar3;
  (pDVar10->super_TimingControlSyntax).super_SyntaxNode.previewNode = pSVar2;
  (pDVar10->hash).kind = TVar4;
  (pDVar10->hash).field_0x2 = uVar5;
  (pDVar10->hash).numFlags = (NumericTokenFlags)NVar6.raw;
  (pDVar10->hash).rawLen = uVar7;
  (pDVar10->super_TimingControlSyntax).super_SyntaxNode.kind = SVar8;
  *(undefined4 *)&(pDVar10->super_TimingControlSyntax).super_SyntaxNode.field_0x4 = uVar9;
  (pDVar10->super_TimingControlSyntax).super_SyntaxNode.parent = pSVar1;
  return pDVar10;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }